

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateTilePipelineState
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,
          TilePipelineStateCreateInfo *PSOCreateInfo,IPipelineState **ppPipelineState)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  IPipelineState **ppPipelineState_local;
  TilePipelineStateCreateInfo *PSOCreateInfo_local;
  RenderDeviceBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = ppPipelineState;
  FormatString<char[96]>
            ((string *)local_40,
             (char (*) [96])
             "Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature."
            );
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"CreateTilePipelineState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
             ,0x12e);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

CreateTilePipelineState(const TilePipelineStateCreateInfo& PSOCreateInfo,
                                                            IPipelineState**                   ppPipelineState) override
    {
        UNSUPPORTED("Tile pipeline is not supported by this device. Please check DeviceFeatures.TileShaders feature.");
    }